

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O2

int output_intelhex(char *fname,int length)

{
  FILE *__s;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  __s = fopen(fname,"w");
  if (__s == (FILE *)0x0) {
    iVar5 = 0;
  }
  else {
    for (uVar1 = 0; uVar2 = length - uVar1, uVar2 != 0 && (int)uVar1 <= length;
        uVar1 = uVar1 + uVar2) {
      if (0x1f < (int)uVar2) {
        uVar2 = 0x20;
      }
      iVar5 = ((int)uVar1 >> 8) + uVar1 + uVar2;
      fprintf(__s,":%2.2X%4.4X00",(ulong)uVar2,(ulong)uVar1);
      uVar4 = 0;
      if (0 < (int)uVar2) {
        uVar4 = (ulong)uVar2;
      }
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        fprintf(__s,"%2.2X",(ulong)ebuf[(long)(int)uVar1 + uVar3]);
        iVar5 = iVar5 + (uint)ebuf[(long)(int)uVar1 + uVar3];
      }
      fprintf(__s,"%2.2X\n",(ulong)(-iVar5 & 0xff));
    }
    fwrite(":00000001FF\n",0xc,1,__s);
    fclose(__s);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int output_intelhex(char *fname, int length)
{
   FILE *fp;
 
   int cc = 0, ll, sum, i;

   fp = fopen(fname, "w");
   if(fp == NULL) 
      return 0;
   while (cc < length)
   {
      ll = length - cc;
      if (ll > IHEXLENGTH) ll = IHEXLENGTH;
      sum = ll + (cc >> 8) + (cc & 0xff);
      fprintf(fp, ":%2.2X%4.4X00", ll, cc);
      for (i = 0; i < ll; i++)
      {
         fprintf(fp, "%2.2X", ebuf[cc + i]);
         sum += ebuf[cc + i];
      }
      fprintf(fp, "%2.2X\n", (0x100 - sum) & 0xff);
      cc += ll;
   }
   fprintf(fp, ":00000001FF\n");   
   fclose(fp);
   
   return 1;
}